

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

pid_t testing::internal::ExecDeathTestSpawnChild(char **argv,int close_fd)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  bool local_7a1;
  long local_7a0;
  int local_774;
  string local_770;
  allocator<char> local_749;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  int local_684;
  string local_680;
  allocator<char> local_659;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  int local_578;
  int local_574;
  int gtest_retval_1;
  allocator<char> local_549;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  int local_484;
  string local_480;
  allocator<char> local_459;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  void *local_398;
  void *stack_top;
  size_t kMaxStackAlignment;
  string local_380;
  allocator<char> local_359;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  void *local_298;
  void *stack;
  size_t stack_size;
  undefined1 local_280 [3];
  bool use_fork;
  allocator<char> local_249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  int local_164;
  _union_1457 _Stack_160;
  int gtest_retval;
  sigaction ignore_sigprof_action;
  sigaction saved_sigprof_action;
  char **ppcStack_28;
  pid_t child_pid;
  ExecDeathTestArgs args;
  int close_fd_local;
  char **argv_local;
  
  saved_sigprof_action.sa_restorer._4_4_ = -1;
  ppcStack_28 = argv;
  args.argv._0_4_ = close_fd;
  args._12_4_ = close_fd;
  memset(&stack0xfffffffffffffea0,0,0x98);
  sigemptyset((sigset_t *)&ignore_sigprof_action);
  _Stack_160 = (_union_1457)0x1;
  do {
    do {
      local_164 = sigaction(0x1b,(sigaction *)&stack0xfffffffffffffea0,
                            (sigaction *)&ignore_sigprof_action.sa_restorer);
      bVar3 = false;
      if (local_164 == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (local_164 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_248,"CHECK failed: File ",&local_249);
      std::operator+(&local_228,&local_248,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/build_O0/test/googletest-src/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_208,&local_228,", line ");
      stack_size._4_4_ = 0x546;
      StreamableToString<int>((string *)local_280,(int *)((long)&stack_size + 4));
      std::operator+(&local_1e8,&local_208,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280)
      ;
      std::operator+(&local_1c8,&local_1e8,": ");
      std::operator+(&local_1a8,&local_1c8,
                     "sigaction( SIGPROF, &ignore_sigprof_action, &saved_sigprof_action)");
      std::operator+(&local_188,&local_1a8," != -1");
      DeathTestAbort(&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)local_280);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator(&local_249);
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  stack_size._3_1_ = FLAGS_gtest_death_test_use_fork & 1;
  if (stack_size._3_1_ == 0) {
    if ((ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') &&
       (iVar1 = __cxa_guard_acquire(&ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down),
       iVar1 != 0)) {
      ExecDeathTestSpawnChild::stack_grows_down = StackGrowsDown();
      __cxa_guard_release(&ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down);
    }
    iVar1 = getpagesize();
    stack = (void *)(long)(iVar1 << 1);
    local_298 = mmap((void *)0x0,(size_t)stack,3,0x22,-1,0);
    do {
      bVar3 = IsTrue(local_298 != (void *)0xffffffffffffffff);
      if (!bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_358,"CHECK failed: File ",&local_359);
        std::operator+(&local_338,&local_358,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/build_O0/test/googletest-src/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_318,&local_338,", line ");
        kMaxStackAlignment._4_4_ = 0x552;
        StreamableToString<int>(&local_380,(int *)((long)&kMaxStackAlignment + 4));
        std::operator+(&local_2f8,&local_318,&local_380);
        std::operator+(&local_2d8,&local_2f8,": ");
        std::operator+(&local_2b8,&local_2d8,"stack != MAP_FAILED");
        DeathTestAbort(&local_2b8);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_380);
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::~string((string *)&local_358);
        std::allocator<char>::~allocator(&local_359);
      }
      bVar3 = AlwaysFalse();
    } while (bVar3);
    stack_top = (void *)0x40;
    if ((ExecDeathTestSpawnChild::stack_grows_down & 1U) == 0) {
      local_7a0 = 0;
    }
    else {
      local_7a0 = (long)stack + -0x40;
    }
    local_398 = (void *)((long)local_298 + local_7a0);
    do {
      local_7a1 = (void *)0x40 < stack && ((ulong)local_398 & 0x3f) == 0;
      bVar3 = IsTrue(local_7a1);
      if (!bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_458,"CHECK failed: File ",&local_459);
        std::operator+(&local_438,&local_458,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/build_O0/test/googletest-src/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_418,&local_438,", line ");
        local_484 = 0x560;
        StreamableToString<int>(&local_480,&local_484);
        std::operator+(&local_3f8,&local_418,&local_480);
        std::operator+(&local_3d8,&local_3f8,": ");
        std::operator+(&local_3b8,&local_3d8,
                       "static_cast<size_t>(stack_size) > kMaxStackAlignment && reinterpret_cast<uintptr_t>(stack_top) % kMaxStackAlignment == 0"
                      );
        DeathTestAbort(&local_3b8);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_3d8);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_480);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)&local_458);
        std::allocator<char>::~allocator(&local_459);
      }
      bVar3 = AlwaysFalse();
    } while (bVar3);
    saved_sigprof_action.sa_restorer._4_4_ =
         clone(ExecDeathTestChildMain,local_398,0x11,&stack0xffffffffffffffd8);
    do {
      iVar1 = munmap(local_298,(size_t)stack);
      bVar3 = IsTrue(iVar1 != -1);
      if (!bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_548,"CHECK failed: File ",&local_549);
        std::operator+(&local_528,&local_548,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/build_O0/test/googletest-src/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_508,&local_528,", line ");
        local_574 = 0x564;
        StreamableToString<int>((string *)&gtest_retval_1,&local_574);
        std::operator+(&local_4e8,&local_508,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &gtest_retval_1);
        std::operator+(&local_4c8,&local_4e8,": ");
        std::operator+(&local_4a8,&local_4c8,"munmap(stack, stack_size) != -1");
        DeathTestAbort(&local_4a8);
        std::__cxx11::string::~string((string *)&local_4a8);
        std::__cxx11::string::~string((string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_4e8);
        std::__cxx11::string::~string((string *)&gtest_retval_1);
        std::__cxx11::string::~string((string *)&local_508);
        std::__cxx11::string::~string((string *)&local_528);
        std::__cxx11::string::~string((string *)&local_548);
        std::allocator<char>::~allocator(&local_549);
      }
      bVar3 = AlwaysFalse();
    } while (bVar3);
  }
  if (((stack_size._3_1_ & 1) != 0) &&
     (saved_sigprof_action.sa_restorer._4_4_ = fork(), saved_sigprof_action.sa_restorer._4_4_ == 0))
  {
    ExecDeathTestChildMain(&stack0xffffffffffffffd8);
    _exit(0);
  }
  do {
    do {
      local_578 = sigaction(0x1b,(sigaction *)&ignore_sigprof_action.sa_restorer,(sigaction *)0x0);
      bVar3 = false;
      if (local_578 == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (local_578 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_658,"CHECK failed: File ",&local_659);
      std::operator+(&local_638,&local_658,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/build_O0/test/googletest-src/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_618,&local_638,", line ");
      local_684 = 0x571;
      StreamableToString<int>(&local_680,&local_684);
      std::operator+(&local_5f8,&local_618,&local_680);
      std::operator+(&local_5d8,&local_5f8,": ");
      std::operator+(&local_5b8,&local_5d8,"sigaction(SIGPROF, &saved_sigprof_action, nullptr)");
      std::operator+(&local_598,&local_5b8," != -1");
      DeathTestAbort(&local_598);
      std::__cxx11::string::~string((string *)&local_598);
      std::__cxx11::string::~string((string *)&local_5b8);
      std::__cxx11::string::~string((string *)&local_5d8);
      std::__cxx11::string::~string((string *)&local_5f8);
      std::__cxx11::string::~string((string *)&local_680);
      std::__cxx11::string::~string((string *)&local_618);
      std::__cxx11::string::~string((string *)&local_638);
      std::__cxx11::string::~string((string *)&local_658);
      std::allocator<char>::~allocator(&local_659);
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  do {
    bVar3 = IsTrue(saved_sigprof_action.sa_restorer._4_4_ != -1);
    if (!bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_748,"CHECK failed: File ",&local_749);
      std::operator+(&local_728,&local_748,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/build_O0/test/googletest-src/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_708,&local_728,", line ");
      local_774 = 0x574;
      StreamableToString<int>(&local_770,&local_774);
      std::operator+(&local_6e8,&local_708,&local_770);
      std::operator+(&local_6c8,&local_6e8,": ");
      std::operator+(&local_6a8,&local_6c8,"child_pid != -1");
      DeathTestAbort(&local_6a8);
      std::__cxx11::string::~string((string *)&local_6a8);
      std::__cxx11::string::~string((string *)&local_6c8);
      std::__cxx11::string::~string((string *)&local_6e8);
      std::__cxx11::string::~string((string *)&local_770);
      std::__cxx11::string::~string((string *)&local_708);
      std::__cxx11::string::~string((string *)&local_728);
      std::__cxx11::string::~string((string *)&local_748);
      std::allocator<char>::~allocator(&local_749);
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  return saved_sigprof_action.sa_restorer._4_4_;
}

Assistant:

static pid_t ExecDeathTestSpawnChild(char* const* argv, int close_fd) {
  ExecDeathTestArgs args = { argv, close_fd };
  pid_t child_pid = -1;

#  if GTEST_OS_QNX
  // Obtains the current directory and sets it to be closed in the child
  // process.
  const int cwd_fd = open(".", O_RDONLY);
  GTEST_DEATH_TEST_CHECK_(cwd_fd != -1);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(fcntl(cwd_fd, F_SETFD, FD_CLOEXEC));
  // We need to execute the test program in the same environment where
  // it was originally invoked.  Therefore we change to the original
  // working directory first.
  const char* const original_dir =
      UnitTest::GetInstance()->original_working_dir();
  // We can safely call chdir() as it's a direct system call.
  if (chdir(original_dir) != 0) {
    DeathTestAbort(std::string("chdir(\"") + original_dir + "\") failed: " +
                   GetLastErrnoDescription());
    return EXIT_FAILURE;
  }

  int fd_flags;
  // Set close_fd to be closed after spawn.
  GTEST_DEATH_TEST_CHECK_SYSCALL_(fd_flags = fcntl(close_fd, F_GETFD));
  GTEST_DEATH_TEST_CHECK_SYSCALL_(fcntl(close_fd, F_SETFD,
                                        fd_flags | FD_CLOEXEC));
  struct inheritance inherit = {0};
  // spawn is a system call.
  child_pid = spawn(args.argv[0], 0, nullptr, &inherit, args.argv, environ);
  // Restores the current working directory.
  GTEST_DEATH_TEST_CHECK_(fchdir(cwd_fd) != -1);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(cwd_fd));

#  else   // GTEST_OS_QNX
#   if GTEST_OS_LINUX
  // When a SIGPROF signal is received while fork() or clone() are executing,
  // the process may hang. To avoid this, we ignore SIGPROF here and re-enable
  // it after the call to fork()/clone() is complete.
  struct sigaction saved_sigprof_action;
  struct sigaction ignore_sigprof_action;
  memset(&ignore_sigprof_action, 0, sizeof(ignore_sigprof_action));
  sigemptyset(&ignore_sigprof_action.sa_mask);
  ignore_sigprof_action.sa_handler = SIG_IGN;
  GTEST_DEATH_TEST_CHECK_SYSCALL_(sigaction(
      SIGPROF, &ignore_sigprof_action, &saved_sigprof_action));
#   endif  // GTEST_OS_LINUX

#   if GTEST_HAS_CLONE
  const bool use_fork = GTEST_FLAG(death_test_use_fork);

  if (!use_fork) {
    static const bool stack_grows_down = StackGrowsDown();
    const auto stack_size = static_cast<size_t>(getpagesize() * 2);
    // MMAP_ANONYMOUS is not defined on Mac, so we use MAP_ANON instead.
    void* const stack = mmap(nullptr, stack_size, PROT_READ | PROT_WRITE,
                             MAP_ANON | MAP_PRIVATE, -1, 0);
    GTEST_DEATH_TEST_CHECK_(stack != MAP_FAILED);

    // Maximum stack alignment in bytes:  For a downward-growing stack, this
    // amount is subtracted from size of the stack space to get an address
    // that is within the stack space and is aligned on all systems we care
    // about.  As far as I know there is no ABI with stack alignment greater
    // than 64.  We assume stack and stack_size already have alignment of
    // kMaxStackAlignment.
    const size_t kMaxStackAlignment = 64;
    void* const stack_top =
        static_cast<char*>(stack) +
            (stack_grows_down ? stack_size - kMaxStackAlignment : 0);
    GTEST_DEATH_TEST_CHECK_(
        static_cast<size_t>(stack_size) > kMaxStackAlignment &&
        reinterpret_cast<uintptr_t>(stack_top) % kMaxStackAlignment == 0);

    child_pid = clone(&ExecDeathTestChildMain, stack_top, SIGCHLD, &args);

    GTEST_DEATH_TEST_CHECK_(munmap(stack, stack_size) != -1);
  }
#   else
  const bool use_fork = true;
#   endif  // GTEST_HAS_CLONE

  if (use_fork && (child_pid = fork()) == 0) {
      ExecDeathTestChildMain(&args);
      _exit(0);
  }
#  endif  // GTEST_OS_QNX
#  if GTEST_OS_LINUX
  GTEST_DEATH_TEST_CHECK_SYSCALL_(
      sigaction(SIGPROF, &saved_sigprof_action, nullptr));
#  endif  // GTEST_OS_LINUX

  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  return child_pid;
}